

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O2

void __thiscall Assimp::Q3BSPFileParser::getIndices(Q3BSPFileParser *this)

{
  int iVar1;
  Q3BSPModel *pQVar2;
  sQ3BSPLump *psVar3;
  
  pQVar2 = this->m_pModel;
  if (pQVar2 != (Q3BSPModel *)0x0) {
    psVar3 = (pQVar2->m_Lumps).
             super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
             ._M_impl.super__Vector_impl_data._M_start[0xb];
    iVar1 = psVar3->iOffset;
    std::vector<int,_std::allocator<int>_>::resize
              (&pQVar2->m_Indices,(ulong)(long)psVar3->iSize >> 2);
    memcpy((this->m_pModel->m_Indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start,
           (this->m_Data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start + iVar1,(long)psVar3->iSize);
    return;
  }
  __assert_fail("nullptr != m_pModel",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Q3BSP/Q3BSPFileParser.cpp"
                ,0xce,"void Assimp::Q3BSPFileParser::getIndices()");
}

Assistant:

void Q3BSPFileParser::getIndices()
{
    ai_assert(nullptr != m_pModel );

    sQ3BSPLump *lump = m_pModel->m_Lumps[ kMeshVerts ];
    size_t Offset = (size_t) lump->iOffset;
    const size_t nIndices = lump->iSize / sizeof( int );
    m_pModel->m_Indices.resize( nIndices );
    memcpy( &m_pModel->m_Indices[ 0 ], &m_Data[ Offset ], lump->iSize );
}